

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_declare_function
          (irGenerator *this,string *_name,SymbolKind kind)

{
  LabelId id;
  mapped_type *pmVar1;
  JumpLabelId *this_00;
  int in_EDX;
  string *in_RSI;
  irGenerator *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_Variable>_>::value,_pair<iterator,_bool>_>
  _Var2;
  FunctionData functionData;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_> params;
  SharedTyPtr ret;
  shared_ptr<mir::types::FunctionTy> type;
  shared_ptr<mir::inst::MirFunction> func;
  string name;
  MirFunction *in_stack_fffffffffffffbf8;
  FunctionData *in_stack_fffffffffffffc00;
  FunctionData *this_01;
  pair<int,_mir::inst::Variable> *in_stack_fffffffffffffc08;
  Variable *in_stack_fffffffffffffc10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  *this_02;
  shared_ptr<mir::types::FunctionTy> *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  mapped_type mVar3;
  MirFunction *in_stack_fffffffffffffc30;
  mapped_type *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  *in_stack_fffffffffffffc48;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  *in_stack_fffffffffffffc50;
  FunctionData local_2b8;
  _Base_ptr local_238;
  shared_ptr<mir::inst::MirFunction> *in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdd9;
  irGenerator *in_stack_fffffffffffffde0;
  string local_1b0 [39];
  undefined1 local_189;
  string local_178 [55];
  undefined1 local_141;
  LabelId local_90;
  LabelId local_8c;
  undefined4 local_88;
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::string::string(local_38);
  std::shared_ptr<mir::inst::MirFunction>::shared_ptr
            ((shared_ptr<mir::inst::MirFunction> *)0x25b2d0);
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x25b2dd);
  std::shared_ptr<mir::types::Ty>::shared_ptr((shared_ptr<mir::types::Ty> *)0x25b2ea);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          *)0x25b2f7);
  FunctionData::FunctionData(in_stack_fffffffffffffc00);
  local_8c = in_RDI->_InitLocalVarId;
  local_90 = in_RDI->_InitTmpVarId;
  local_88 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (key_type *)in_stack_fffffffffffffc38);
  FunctionData::operator=(in_stack_fffffffffffffc00,(FunctionData *)in_stack_fffffffffffffbf8);
  if (local_14 == 0) {
    operator_new(8);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffc00);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
               (IntTy *)in_stack_fffffffffffffbf8);
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
               (shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffbf8);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25b404);
  }
  else if (local_14 == 1) {
    operator_new(8);
    mir::types::VoidTy::VoidTy((VoidTy *)in_stack_fffffffffffffc00);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
               (VoidTy *)in_stack_fffffffffffffbf8);
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
               (shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffbf8);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25b490);
  }
  std::__cxx11::string::operator=(local_38,in_RSI);
  operator_new(0x38);
  local_141 = 1;
  std::shared_ptr<mir::types::Ty>::shared_ptr
            ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
             (shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffbf8);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  vector(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  mir::types::FunctionTy::FunctionTy
            ((FunctionTy *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
             (SharedTyPtr *)in_stack_fffffffffffffc38,
             (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
              *)in_stack_fffffffffffffc30,SUB41((uint)in_stack_fffffffffffffc2c >> 0x18,0));
  local_141 = 0;
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
            ((shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffc00,
             (FunctionTy *)in_stack_fffffffffffffbf8);
  std::shared_ptr<mir::types::FunctionTy>::operator=
            ((shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffc00,
             (shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffbf8);
  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x25b588);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
           *)in_stack_fffffffffffffc10);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25b5a2);
  operator_new(0x98);
  local_189 = 1;
  std::__cxx11::string::string(local_178,local_38);
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffc00,
             (shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffbf8);
  mir::inst::MirFunction::MirFunction
            (in_stack_fffffffffffffc30,
             (string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
             in_stack_fffffffffffffc20);
  local_189 = 0;
  std::shared_ptr<mir::inst::MirFunction>::shared_ptr<mir::inst::MirFunction,void>
            ((shared_ptr<mir::inst::MirFunction> *)in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8);
  std::shared_ptr<mir::inst::MirFunction>::operator=
            ((shared_ptr<mir::inst::MirFunction> *)in_stack_fffffffffffffc00,
             (shared_ptr<mir::inst::MirFunction> *)in_stack_fffffffffffffbf8);
  std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
            ((shared_ptr<mir::inst::MirFunction> *)0x25b65a);
  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x25b667);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::string(local_1b0,local_38);
  std::shared_ptr<mir::inst::MirFunction>::shared_ptr
            ((shared_ptr<mir::inst::MirFunction> *)in_stack_fffffffffffffc00,
             (shared_ptr<mir::inst::MirFunction> *)in_stack_fffffffffffffbf8);
  insertFunc(in_stack_fffffffffffffde0,
             (string *)CONCAT71(in_stack_fffffffffffffdd9,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0);
  std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
            ((shared_ptr<mir::inst::MirFunction> *)0x25b6d4);
  std::__cxx11::string::~string(local_1b0);
  std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x25b704);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffc00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *)in_stack_fffffffffffffbf8,(key_type *)0x25b74d);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                *)0x25b774);
  operator_new(8);
  mir::types::VoidTy::VoidTy((VoidTy *)in_stack_fffffffffffffc00);
  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
            ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
             (VoidTy *)in_stack_fffffffffffffbf8);
  mir::inst::Variable::Variable
            (in_stack_fffffffffffffc10,(SharedTyPtr *)in_stack_fffffffffffffc08,
             SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffc00 >> 0x30,0),
             SUB81((ulong)in_stack_fffffffffffffc00 >> 0x28,0));
  std::pair<int,_mir::inst::Variable>::pair<mir::inst::Variable,_true>
            ((pair<int,_mir::inst::Variable> *)in_stack_fffffffffffffc00,
             (int *)in_stack_fffffffffffffbf8,(Variable *)0x25b810);
  std::
  map<unsigned_int,mir::inst::Variable,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::insert<std::pair<int,mir::inst::Variable>>
            ((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::pair<int,_mir::inst::Variable>::~pair((pair<int,_mir::inst::Variable> *)0x25b863);
  mir::inst::Variable::~Variable((Variable *)0x25b870);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25b87d);
  mVar3 = in_RDI->_VoidVarId;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffc00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (key_type *)in_stack_fffffffffffffc38);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                        (key_type *)in_stack_fffffffffffffc38);
  *pmVar1 = mVar3;
  if (local_14 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc00);
    local_238 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                        *)in_stack_fffffffffffffbf8,(key_type *)0x25b93b);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x25b95c);
    operator_new(8);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffc00);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffc00,
               (IntTy *)in_stack_fffffffffffffbf8);
    mir::inst::Variable::Variable
              (in_stack_fffffffffffffc10,(SharedTyPtr *)in_stack_fffffffffffffc08,
               SUB81((ulong)in_stack_fffffffffffffc00 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffc00 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffffc00 >> 0x28,0));
    std::pair<int,_mir::inst::Variable>::pair<mir::inst::Variable,_true>
              ((pair<int,_mir::inst::Variable> *)in_stack_fffffffffffffc00,
               (int *)in_stack_fffffffffffffbf8,(Variable *)0x25b9e6);
    _Var2 = std::
            map<unsigned_int,mir::inst::Variable,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
            ::insert<std::pair<int,mir::inst::Variable>>
                      ((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    local_2b8._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)_Var2.first._M_node;
    in_stack_fffffffffffffc47 = _Var2.second;
    local_2b8._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
         in_stack_fffffffffffffc47;
    std::pair<int,_mir::inst::Variable>::~pair((pair<int,_mir::inst::Variable> *)0x25ba2a);
    mir::inst::Variable::~Variable((Variable *)0x25ba37);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25ba44);
    mVar3 = in_RDI->_ReturnVarId;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc38 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                      (key_type *)in_stack_fffffffffffffc38);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                          (key_type *)in_stack_fffffffffffffc38);
    *pmVar1 = mVar3;
  }
  this_02 = &in_RDI->_funcNameToInstructions;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffc00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (key_type *)in_stack_fffffffffffffc38);
  this_00 = (JumpLabelId *)operator_new(4);
  id = getNewLabelId(in_RDI);
  JumpLabelId::JumpLabelId(this_00,id);
  std::shared_ptr<front::irGenerator::JumpLabelId>::shared_ptr<front::irGenerator::JumpLabelId,void>
            ((shared_ptr<front::irGenerator::JumpLabelId> *)in_stack_fffffffffffffc00,
             (JumpLabelId *)in_stack_fffffffffffffbf8);
  this_01 = &local_2b8;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::
  variant<std::shared_ptr<front::irGenerator::JumpLabelId>,void,void,std::shared_ptr<front::irGenerator::JumpLabelId>,void>
            ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)this_01,(shared_ptr<front::irGenerator::JumpLabelId> *)in_stack_fffffffffffffbf8);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_01,(value_type *)in_stack_fffffffffffffbf8);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x25bd8c);
  std::shared_ptr<front::irGenerator::JumpLabelId>::~shared_ptr
            ((shared_ptr<front::irGenerator::JumpLabelId> *)0x25bd99);
  FunctionData::~FunctionData(this_01);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
           *)this_02);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25bdc0);
  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x25bdcd);
  std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
            ((shared_ptr<mir::inst::MirFunction> *)0x25bdda);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void irGenerator::ir_declare_function(string _name, symbol::SymbolKind kind) {
  string name;
  shared_ptr<mir::inst::MirFunction> func;
  shared_ptr<FunctionTy> type;
  SharedTyPtr ret;
  std::vector<SharedTyPtr> params;
  FunctionData functionData;

  functionData._nowLocalValueId = _InitLocalVarId;
  functionData._nowTmpId = _InitTmpVarId;
  functionData._frontInstsNum = 0;
  _funcNameToFuncData[_name] = functionData;

  switch (kind) {
    case front::symbol::SymbolKind::INT:
      ret = SharedTyPtr(new IntTy());
      break;
    case front::symbol::SymbolKind::VID:
      ret = SharedTyPtr(new VoidTy());
      break;
    default:
      break;
  }
  name = _name;
  type = shared_ptr<FunctionTy>(new FunctionTy(ret, params, false));
  func = shared_ptr<mir::inst::MirFunction>(
      new mir::inst::MirFunction(name, type));

  insertFunc(name, func);
  _funcStack.push_back(func->name);

  _package.functions.find(_funcStack.back())
      ->second.variables.insert(std::pair(
          _VoidVarId, Variable(SharedTyPtr(new VoidTy()), false, false)));
  _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_VoidVarName] =
      _VoidVarId;
  if (kind == front::symbol::SymbolKind::INT) {
    _package.functions.find(_funcStack.back())
        ->second.variables.insert(std::pair(
            _ReturnVarId, Variable(SharedTyPtr(new IntTy()), false, false)));
    _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_ReturnVarName] =
        _ReturnVarId;
  }
  _funcNameToInstructions[_funcStack.back()].push_back(
      shared_ptr<JumpLabelId>(new JumpLabelId(getNewLabelId())));
}